

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Slice.h
# Opt level: O3

Slice __thiscall
arangodb::velocypack::SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice>::value
          (SliceBase<arangodb::velocypack::Slice,_arangodb::velocypack::Slice> *this)

{
  byte *pbVar1;
  Slice SVar2;
  uint8_t ret;
  byte bVar3;
  char cVar4;
  byte bVar5;
  byte *pbVar6;
  
  SVar2._start = *(uint8_t **)this;
  bVar5 = *SVar2._start;
  if ((bVar5 & 0xfe) == 0xee) {
    bVar3 = 0;
    pbVar6 = SVar2._start;
    do {
      pbVar1 = pbVar6 + 9;
      pbVar6 = pbVar6 + 2;
      cVar4 = '\x02';
      if (bVar5 != 0xee) {
        pbVar6 = pbVar1;
        cVar4 = '\t';
      }
      bVar3 = bVar3 + cVar4;
      bVar5 = *pbVar6;
    } while ((bVar5 & 0xfe) == 0xee);
    SVar2._start = SVar2._start + bVar3;
  }
  return (Slice)SVar2._start;
}

Assistant:

uint8_t const* getDataPtr() const noexcept { return _start; }